

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBigDecimal.cpp
# Opt level: O1

XMLCh * xercesc_4_0::XMLBigDecimal::getCanonicalRepresentation(XMLCh *rawData,MemoryManager *memMgr)

{
  short *psVar1;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  XMLCh *pXVar4;
  XMLCh *pXVar5;
  long lVar6;
  XMLCh *pXVar7;
  XMLSize_t maxChars;
  XMLSize_t XVar8;
  int fractDigits;
  int totalDigits;
  int sign;
  ArrayJanitor<char16_t> janName;
  int local_4c;
  int local_48;
  int local_44;
  ArrayJanitor<char16_t> local_40;
  char16_t *toDelete;
  undefined4 extraout_var_00;
  
  if (rawData == (XMLCh *)0x0) {
    lVar6 = 2;
  }
  else {
    lVar3 = 0;
    do {
      lVar6 = lVar3 + 2;
      psVar1 = (short *)((long)rawData + lVar3);
      lVar3 = lVar6;
    } while (*psVar1 != 0);
  }
  iVar2 = (*memMgr->_vptr_MemoryManager[3])(memMgr,lVar6);
  toDelete = (char16_t *)CONCAT44(extraout_var,iVar2);
  ArrayJanitor<char16_t>::ArrayJanitor(&local_40,toDelete,memMgr);
  parseDecimal(rawData,toDelete,&local_44,&local_48,&local_4c,memMgr);
  XVar8 = 0;
  if (toDelete != (char16_t *)0x0) {
    do {
      psVar1 = (short *)((long)toDelete + XVar8);
      XVar8 = XVar8 + 2;
    } while (*psVar1 != 0);
    XVar8 = ((long)XVar8 >> 1) - 1;
  }
  iVar2 = (*memMgr->_vptr_MemoryManager[3])(memMgr,XVar8 * 2 + 8);
  pXVar4 = (XMLCh *)CONCAT44(extraout_var_00,iVar2);
  if (local_48 == 0 || local_44 == 0) {
    pXVar4[0] = L'0';
    pXVar4[1] = L'.';
    pXVar4[2] = L'0';
    pXVar5 = pXVar4 + 3;
  }
  else {
    pXVar7 = pXVar4;
    if (local_44 == -1) {
      pXVar7 = pXVar4 + 1;
      *pXVar4 = L'-';
    }
    maxChars = (XMLSize_t)local_4c;
    if (local_48 == local_4c) {
      pXVar7[0] = L'0';
      pXVar7[1] = L'.';
      XMLString::copyNString(pXVar7 + 2,toDelete,XVar8);
      pXVar5 = pXVar7 + 2 + XVar8;
    }
    else if (local_4c == 0) {
      XMLString::copyNString(pXVar7,toDelete,XVar8);
      pXVar7 = pXVar7 + XVar8;
      pXVar5 = pXVar7 + 2;
      pXVar7[0] = L'.';
      pXVar7[1] = L'0';
    }
    else {
      XVar8 = (XMLSize_t)(local_48 - local_4c);
      XMLString::copyNString(pXVar7,toDelete,XVar8);
      pXVar7 = pXVar7 + XVar8;
      *pXVar7 = L'.';
      XMLString::copyNString(pXVar7 + 1,toDelete + XVar8,maxChars);
      pXVar5 = pXVar7 + 1 + local_4c;
    }
  }
  *pXVar5 = L'\0';
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
  return pXVar4;
}

Assistant:

XMLCh* XMLBigDecimal::getCanonicalRepresentation(const XMLCh*         const rawData
                                               ,       MemoryManager* const memMgr)
{

    XMLCh* retBuf = (XMLCh*) memMgr->allocate( (XMLString::stringLen(rawData)+1) * sizeof(XMLCh));
    ArrayJanitor<XMLCh> janName(retBuf, memMgr);
    int   sign, totalDigits, fractDigits;

    try
    {
        parseDecimal(rawData, retBuf, sign, totalDigits, fractDigits, memMgr);
    }
    catch (const NumberFormatException&)
    {
        return 0;
    }


    //Extra space reserved in case strLen is zero
    XMLSize_t strLen = XMLString::stringLen(retBuf);
    XMLCh* retBuffer = (XMLCh*) memMgr->allocate( (strLen + 4) * sizeof(XMLCh));

    if ( (sign == 0) || (totalDigits == 0))
    {
        retBuffer[0] = chDigit_0;
        retBuffer[1] = chPeriod;
        retBuffer[2] = chDigit_0;
        retBuffer[3] = chNull;
    }
    else
    {
        XMLCh* retPtr = retBuffer;

        if (sign == -1)
        {
            *retPtr++ = chDash;
        }

        if (fractDigits == totalDigits)   // no integer
        {           
            *retPtr++ = chDigit_0;
            *retPtr++ = chPeriod;
            XMLString::copyNString(retPtr, retBuf, strLen);
            retPtr += strLen;
            *retPtr = chNull;
        }
        else if (fractDigits == 0)        // no fraction
        {
            XMLString::copyNString(retPtr, retBuf, strLen);
            retPtr += strLen;
            *retPtr++ = chPeriod;
            *retPtr++ = chDigit_0;
            *retPtr   = chNull;
        }
        else  // normal
        {
            int intLen = totalDigits - fractDigits;
            XMLString::copyNString(retPtr, retBuf, intLen);
            retPtr += intLen;
            *retPtr++ = chPeriod;
            XMLString::copyNString(retPtr, &(retBuf[intLen]), fractDigits);
            retPtr += fractDigits;
            *retPtr = chNull;
        }

    }
            
    return retBuffer;
}